

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GetTextureSubImage::Functional::check(Functional *this,GLenum target,bool is_compressed)

{
  ostringstream *this_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  void *pvVar5;
  undefined4 *puVar6;
  byte bVar7;
  GLubyte *pGVar8;
  bool bVar9;
  undefined7 in_register_00000011;
  uint uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  GLint GVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  bVar20 = target != 0xde0;
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  uVar10 = (uint)bVar20 * 3 + 1;
  bVar9 = target == 0x8c1a || target == 0x806f;
  iVar19 = (uint)bVar9 * 3 + 1;
  GVar17 = (uint)bVar9 << 2;
  if (target == 0x9009 || target == 0x8513) {
    iVar19 = 3;
    GVar17 = 3;
  }
  iVar3 = (int)CONCAT71(in_register_00000011,is_compressed);
  uVar16 = (uint)bVar20 * 0xc + 4;
  if (iVar3 != 0) {
    uVar16 = uVar10 >> 2;
  }
  bVar7 = is_compressed + 2;
  uVar16 = uVar16 * iVar19 << (bVar7 & 0x1f);
  pvVar5 = operator_new__((ulong)uVar16);
  if (iVar3 == 0) {
    (*this->m_gl_GetTextureSubImage)
              (this->m_texture,0,4,(uint)bVar20 << 2,GVar17,4,uVar10,iVar19,0x1908,0x1401,uVar16,
               pvVar5);
  }
  else {
    (*this->m_gl_GetCompressedTextureSubImage)
              (this->m_texture,0,4,(uint)bVar20 << 2,GVar17,4,uVar10,iVar19,uVar16,pvVar5);
  }
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0) {
    operator_delete__(pvVar5);
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  iVar2 = iVar3 * 3 + 1;
  bVar1 = is_compressed * '\x02';
  iVar14 = (uint)!is_compressed + (uint)!is_compressed * 2 + 1;
  iVar13 = 0;
  bVar9 = true;
  do {
    if (iVar13 == iVar19) {
      operator_delete__(pvVar5);
      if (!bVar9) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Functional test of ");
        pcVar11 = "glGetTextureSubImage ";
        if (is_compressed) {
          pcVar11 = "glGetCompressedTextureSubImage ";
        }
        std::operator<<((ostream *)this_00,pcVar11);
        std::operator<<((ostream *)this_00,"function has failed with target ");
        local_1c0.m_getName = glu::getTextureTargetName;
        local_1c0.m_value = target;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
        std::operator<<((ostream *)this_00,".");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
      }
      return bVar9;
    }
    for (uVar16 = 0; uVar16 != uVar10 >> (bVar1 & 0x1f); uVar16 = uVar16 + 1) {
      for (iVar12 = 0; iVar12 != iVar14; iVar12 = iVar12 + 1) {
        iVar18 = 0;
        do {
          if (iVar3 * 4 + 4 == iVar18) goto LAB_009795e9;
          uVar15 = ((int)(((uint)((iVar13 + GVar17) * 8) >> (bVar1 & 0x1f)) << 3) / iVar2 +
                    iVar12 + iVar14 +
                    (((((uint)bVar20 << 2) >> (bVar1 & 0x1f)) + uVar16) * 8 >> (bVar1 & 0x1f)) <<
                   (bVar7 & 0x1f)) + iVar18;
          uVar4 = ((int)(((uint)(iVar13 * 4) >> (bVar1 & 0x1f)) << (target != 0xde0) * '\x02') /
                   iVar2 + (uVar16 * 4 >> (bVar1 & 0x1f)) + iVar12 << (bVar7 & 0x1f)) + iVar18;
          pGVar8 = "";
          if (is_compressed) {
            pGVar8 = s_texture_data_compressed;
          }
          iVar18 = iVar18 + 1;
        } while (pGVar8[uVar15] == *(GLubyte *)((long)pvVar5 + (ulong)uVar4));
        bVar9 = false;
LAB_009795e9:
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

bool gl4cts::GetTextureSubImage::Functional::check(glw::GLenum target, bool is_compressed)
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Arguments setup (depends on dimmension) */
	glw::GLint x_offset = s_texture_data_width / 2 /* half */;
	glw::GLint width	= s_texture_data_width / 2 /* half */;

	glw::GLint y_offset = 0;
	glw::GLint height   = 1;

	glw::GLint z_offset = 0;
	glw::GLint depth	= 1;

	/* For 2 and 3 -dimensional textures setup y-direction. */
	if (GL_TEXTURE_1D != target)
	{
		y_offset = s_texture_data_height / 2 /* half */;
		height   = s_texture_data_height / 2 /* half */;
	}

	/* For 3-dimensional textures setup z-direction. */
	if ((GL_TEXTURE_3D == target) || (GL_TEXTURE_2D_ARRAY == target))
	{
		z_offset = s_texture_data_depth / 2 /* half */;
		depth	= s_texture_data_depth / 2 /* half */;
	}

	/* For cube-map texture stup 6-cube faces. */
	if ((GL_TEXTURE_CUBE_MAP == target) || (GL_TEXTURE_CUBE_MAP_ARRAY == target))
	{
		z_offset = 3; /* half of cube map */
		depth	= 3; /* half of cube map */
	}

	/* Setup number of components. */
	glw::GLint number_of_components = 0;

	if (is_compressed)
	{
		number_of_components = 8; /* 64 bit block of 4x4 compressed pixels. */
	}
	else
	{
		number_of_components = 4; /* RGBA components. */
	}

	/* Setup size. */
	glw::GLsizei size = 0;

	/* Iterate over pixels. */
	glw::GLint x_block = 1;
	glw::GLint y_block = 1;

	if (is_compressed)
	{
		/* Iterate over 4x4 compressed pixel block. */
		x_block = 4;
		y_block = 4;

		size = static_cast<glw::GLsizei>((width / x_block) * (height / y_block) * depth * number_of_components *
										 sizeof(glw::GLubyte));
	}
	else
	{
		size = static_cast<glw::GLsizei>(width * height * depth * number_of_components * sizeof(glw::GLubyte));
	}

	/* Storage for fetched texturte. */
	glw::GLubyte* texture_data = new glw::GLubyte[size];

	if (DE_NULL == texture_data)
	{
		throw 0;
	}

	/* Fetching texture. */
	if (is_compressed)
	{
		m_gl_GetCompressedTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, size,
										  texture_data);
	}
	else
	{
		m_gl_GetTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, GL_RGBA,
								GL_UNSIGNED_BYTE, size, texture_data);
	}

	/* Comprae fetched texture with reference. */
	glw::GLint error = gl.getError();

	bool is_ok = true;

	if (GL_NO_ERROR == error)
	{
		for (glw::GLint k = 0; k < depth; ++k)
		{
			for (glw::GLint j = 0; j < height / y_block; ++j)
			{
				for (glw::GLint i = 0; i < width / x_block; ++i)
				{
					for (glw::GLint c = 0; c < number_of_components; ++c) /* RGBA components iterating */
					{
						glw::GLuint reference_data_position =
							(i + (x_offset / x_block)) * number_of_components +
							(j + (y_offset / y_block)) * s_texture_data_width / x_block * number_of_components +
							(k + z_offset) * s_texture_data_width / x_block * s_texture_data_height / y_block *
								number_of_components +
							c;

						glw::GLuint tested_data_position =
							i * number_of_components + j * width / x_block * number_of_components +
							k * width / x_block * height / y_block * number_of_components + c;

						glw::GLubyte reference_value = (is_compressed) ?
														   s_texture_data_compressed[reference_data_position] :
														   s_texture_data[reference_data_position];
						glw::GLubyte tested_value = texture_data[tested_data_position];

						if (reference_value != tested_value)
						{
							is_ok = false;
							break;
						}
					}
				}
			}
		}
	}
	else
	{
		/* GL error. */
		delete[] texture_data;
		throw 0;
	}

	/* Cleanup. */
	delete[] texture_data;

	/* Error reporting. */
	if (!is_ok)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Functional test of "
						   << ((is_compressed) ? "glGetCompressedTextureSubImage " : "glGetTextureSubImage ")
						   << "function has failed with target " << glu::getTextureTargetStr(target) << "."
						   << tcu::TestLog::EndMessage;
	}

	/* Return result. */
	return is_ok;
}